

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::LayerParameter::MergePartialFromCodedStream(LayerParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  byte *pbVar1;
  uint32 *puVar2;
  ArenaStringPtr *this_03;
  ArenaStringPtr *this_04;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  void *pvVar6;
  uint8 *puVar7;
  Arena *pAVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  int length;
  int iVar12;
  uint32 uVar13;
  TransformationParameter *this_05;
  InputParameter *this_06;
  EmbedParameter *this_07;
  FlattenParameter *this_08;
  ReductionParameter *this_09;
  TanHParameter *this_10;
  LogParameter *this_11;
  InfogainLossParameter *this_12;
  CropParameter *this_13;
  HingeLossParameter *this_14;
  ReshapeParameter *this_15;
  ExpParameter *this_16;
  ConcatParameter *this_17;
  ELUParameter *this_18;
  HDF5DataParameter *this_19;
  DummyDataParameter *this_20;
  SoftmaxParameter *this_21;
  SigmoidParameter *this_22;
  AccuracyParameter *this_23;
  ImageDataParameter *this_24;
  ArgMaxParameter *this_25;
  DataParameter *this_26;
  LossParameter *this_27;
  PReLUParameter *this_28;
  InnerProductParameter *this_29;
  Type *this_30;
  BiasParameter *this_31;
  MVNParameter *this_32;
  ContrastiveLossParameter *this_33;
  PoolingParameter *this_34;
  Type *this_35;
  HDF5OutputParameter *this_36;
  ConvolutionParameter *this_37;
  Type *this_38;
  LRNParameter *this_39;
  EltwiseParameter *this_40;
  DropoutParameter *this_41;
  PythonParameter *this_42;
  SPPParameter *this_43;
  ParameterParameter *this_44;
  PowerParameter *this_45;
  BatchNormParameter *this_46;
  MemoryDataParameter *this_47;
  ScaleParameter *this_48;
  ReLUParameter *this_49;
  ThresholdParameter *this_50;
  WindowDataParameter *this_51;
  TileParameter *this_52;
  SliceParameter *this_53;
  RecurrentParameter *this_54;
  pair<int,_int> pVar14;
  string *psVar15;
  Type *pTVar16;
  int64 iVar17;
  UnknownFieldSet *pUVar18;
  RepeatedPtrFieldBase *this_55;
  Rep *pRVar19;
  char cVar20;
  uint uVar21;
  ulong uVar22;
  
  this_00 = &this->_internal_metadata_;
  this_01 = &this->top_;
  this_02 = &this->bottom_;
  this_03 = &this->type_;
  this_04 = &this->name_;
LAB_003fdd74:
  pbVar5 = input->buffer_;
  uVar13 = 0;
  if (pbVar5 < input->buffer_end_) {
    bVar3 = *pbVar5;
    uVar13 = (uint32)bVar3;
    pbVar1 = pbVar5 + 1;
    uVar21 = (uint)bVar3;
    if ((char)bVar3 < '\x01') {
      if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar21) < 0x80)) goto LAB_003ffe80;
      uVar21 = ((uint)bVar3 + (uint)*pbVar1 * 0x80) - 0x80;
      input->buffer_ = pbVar5 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar22 = (ulong)uVar21 | 0x100000000;
  }
  else {
LAB_003ffe80:
    uVar13 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar13);
    uVar22 = 0;
    if (uVar13 - 1 < 0x3fff) {
      uVar22 = 0x100000000;
    }
    uVar22 = uVar13 | uVar22;
  }
  uVar21 = (uint)uVar22;
  if ((uVar22 & 0x100000000) == 0) goto switchD_003fdea5_default;
  uVar10 = (uint)(uVar22 >> 3) & 0x1fffffff;
  cVar20 = (char)uVar22;
  switch(uVar10) {
  case 100:
    if (cVar20 != '\"') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
    this_05 = this->transform_param_;
    if (this_05 == (TransformationParameter *)0x0) {
      this_05 = (TransformationParameter *)operator_new(0x40);
      TransformationParameter::TransformationParameter(this_05);
      this->transform_param_ = this_05;
    }
    puVar7 = input->buffer_;
    if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
      input->buffer_ = puVar7 + 1;
    }
    else {
      iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
      if (iVar12 < 0) {
        return false;
      }
    }
    pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                       (input,iVar12);
    if ((long)pVar14 < 0) {
      return false;
    }
    bVar11 = TransformationParameter::MergePartialFromCodedStream(this_05,input);
LAB_003ffbf1:
    if (bVar11 == false) {
      return false;
    }
    bVar11 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                       (input,pVar14.first);
    goto joined_r0x003ffc09;
  case 0x65:
    if (cVar20 == '*') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      this_27 = this->loss_param_;
      if (this_27 == (LossParameter *)0x0) {
        this_27 = (LossParameter *)operator_new(0x28);
        LossParameter::LossParameter(this_27);
        this->loss_param_ = this_27;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = LossParameter::MergePartialFromCodedStream(this_27,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x66:
    if (cVar20 == '2') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      this_23 = this->accuracy_param_;
      if (this_23 == (AccuracyParameter *)0x0) {
        this_23 = (AccuracyParameter *)operator_new(0x28);
        AccuracyParameter::AccuracyParameter(this_23);
        this->accuracy_param_ = this_23;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = AccuracyParameter::MergePartialFromCodedStream(this_23,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x67:
    if (cVar20 == ':') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      this_25 = this->argmax_param_;
      if (this_25 == (ArgMaxParameter *)0x0) {
        this_25 = (ArgMaxParameter *)operator_new(0x28);
        ArgMaxParameter::ArgMaxParameter(this_25);
        this->argmax_param_ = this_25;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ArgMaxParameter::MergePartialFromCodedStream(this_25,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x68:
    if (cVar20 == 'B') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      this_17 = this->concat_param_;
      if (this_17 == (ConcatParameter *)0x0) {
        this_17 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(this_17);
        this->concat_param_ = this_17;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ConcatParameter::MergePartialFromCodedStream(this_17,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x69:
    if (cVar20 == 'J') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      this_33 = this->contrastive_loss_param_;
      if (this_33 == (ContrastiveLossParameter *)0x0) {
        this_33 = (ContrastiveLossParameter *)operator_new(0x20);
        ContrastiveLossParameter::ContrastiveLossParameter(this_33);
        this->contrastive_loss_param_ = this_33;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ContrastiveLossParameter::MergePartialFromCodedStream(this_33,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x6a:
    if (cVar20 == 'R') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 1;
      this_37 = this->convolution_param_;
      if (this_37 == (ConvolutionParameter *)0x0) {
        this_37 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(this_37);
        this->convolution_param_ = this_37;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ConvolutionParameter::MergePartialFromCodedStream(this_37,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x6b:
    if (cVar20 == 'Z') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 2;
      this_26 = this->data_param_;
      if (this_26 == (DataParameter *)0x0) {
        this_26 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(this_26);
        this->data_param_ = this_26;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = DataParameter::MergePartialFromCodedStream(this_26,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x6c:
    if (cVar20 == 'b') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 4;
      this_41 = this->dropout_param_;
      if (this_41 == (DropoutParameter *)0x0) {
        this_41 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(this_41);
        this->dropout_param_ = this_41;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = DropoutParameter::MergePartialFromCodedStream(this_41,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x6d:
    if (cVar20 == 'j') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 8;
      this_20 = this->dummy_data_param_;
      if (this_20 == (DummyDataParameter *)0x0) {
        this_20 = (DummyDataParameter *)operator_new(0x88);
        DummyDataParameter::DummyDataParameter(this_20);
        this->dummy_data_param_ = this_20;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = DummyDataParameter::MergePartialFromCodedStream(this_20,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x6e:
    if (cVar20 == 'r') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 0x10;
      this_40 = this->eltwise_param_;
      if (this_40 == (EltwiseParameter *)0x0) {
        this_40 = (EltwiseParameter *)operator_new(0x30);
        EltwiseParameter::EltwiseParameter(this_40);
        this->eltwise_param_ = this_40;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = EltwiseParameter::MergePartialFromCodedStream(this_40,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x6f:
    if (cVar20 == 'z') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 0x20;
      this_16 = this->exp_param_;
      if (this_16 == (ExpParameter *)0x0) {
        this_16 = (ExpParameter *)operator_new(0x28);
        ExpParameter::ExpParameter(this_16);
        this->exp_param_ = this_16;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ExpParameter::MergePartialFromCodedStream(this_16,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x70:
    if (cVar20 == -0x7e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 0x40;
      this_19 = this->hdf5_data_param_;
      if (this_19 == (HDF5DataParameter *)0x0) {
        this_19 = (HDF5DataParameter *)operator_new(0x28);
        HDF5DataParameter::HDF5DataParameter(this_19);
        this->hdf5_data_param_ = this_19;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = HDF5DataParameter::MergePartialFromCodedStream(this_19,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x71:
    if (cVar20 == -0x76) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar5 = *pbVar5 | 0x80;
      this_36 = this->hdf5_output_param_;
      if (this_36 == (HDF5OutputParameter *)0x0) {
        this_36 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(this_36);
        this->hdf5_output_param_ = this_36;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = HDF5OutputParameter::MergePartialFromCodedStream(this_36,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x72:
    if (cVar20 == -0x6e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 1;
      this_14 = this->hinge_loss_param_;
      if (this_14 == (HingeLossParameter *)0x0) {
        this_14 = (HingeLossParameter *)operator_new(0x20);
        HingeLossParameter::HingeLossParameter(this_14);
        this->hinge_loss_param_ = this_14;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = HingeLossParameter::MergePartialFromCodedStream(this_14,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x73:
    if (cVar20 == -0x66) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 2;
      this_24 = this->image_data_param_;
      if (this_24 == (ImageDataParameter *)0x0) {
        this_24 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(this_24);
        this->image_data_param_ = this_24;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ImageDataParameter::MergePartialFromCodedStream(this_24,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x74:
    if (cVar20 == -0x5e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 4;
      this_12 = this->infogain_loss_param_;
      if (this_12 == (InfogainLossParameter *)0x0) {
        this_12 = (InfogainLossParameter *)operator_new(0x20);
        InfogainLossParameter::InfogainLossParameter(this_12);
        this->infogain_loss_param_ = this_12;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = InfogainLossParameter::MergePartialFromCodedStream(this_12,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x75:
    if (cVar20 == -0x56) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 8;
      this_29 = this->inner_product_param_;
      if (this_29 == (InnerProductParameter *)0x0) {
        this_29 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(this_29);
        this->inner_product_param_ = this_29;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = InnerProductParameter::MergePartialFromCodedStream(this_29,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x76:
    if (cVar20 == -0x4e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 0x10;
      this_39 = this->lrn_param_;
      if (this_39 == (LRNParameter *)0x0) {
        this_39 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(this_39);
        this->lrn_param_ = this_39;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = LRNParameter::MergePartialFromCodedStream(this_39,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x77:
    if (cVar20 == -0x46) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 0x20;
      this_47 = this->memory_data_param_;
      if (this_47 == (MemoryDataParameter *)0x0) {
        this_47 = (MemoryDataParameter *)operator_new(0x28);
        MemoryDataParameter::MemoryDataParameter(this_47);
        this->memory_data_param_ = this_47;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = MemoryDataParameter::MergePartialFromCodedStream(this_47,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x78:
    if (cVar20 == -0x3e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 0x40;
      this_32 = this->mvn_param_;
      if (this_32 == (MVNParameter *)0x0) {
        this_32 = (MVNParameter *)operator_new(0x20);
        MVNParameter::MVNParameter(this_32);
        this->mvn_param_ = this_32;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = MVNParameter::MergePartialFromCodedStream(this_32,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x79:
    if (cVar20 == -0x36) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar5 = *pbVar5 | 0x80;
      this_34 = this->pooling_param_;
      if (this_34 == (PoolingParameter *)0x0) {
        this_34 = (PoolingParameter *)operator_new(0x48);
        PoolingParameter::PoolingParameter(this_34);
        this->pooling_param_ = this_34;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = PoolingParameter::MergePartialFromCodedStream(this_34,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x7a:
    if (cVar20 == -0x2e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 1;
      this_45 = this->power_param_;
      if (this_45 == (PowerParameter *)0x0) {
        this_45 = (PowerParameter *)operator_new(0x28);
        PowerParameter::PowerParameter(this_45);
        this->power_param_ = this_45;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = PowerParameter::MergePartialFromCodedStream(this_45,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x7b:
    if (cVar20 == -0x26) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 2;
      this_49 = this->relu_param_;
      if (this_49 == (ReLUParameter *)0x0) {
        this_49 = (ReLUParameter *)operator_new(0x20);
        ReLUParameter::ReLUParameter(this_49);
        this->relu_param_ = this_49;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ReLUParameter::MergePartialFromCodedStream(this_49,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x7c:
    if (cVar20 == -0x1e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 4;
      this_22 = this->sigmoid_param_;
      if (this_22 == (SigmoidParameter *)0x0) {
        this_22 = (SigmoidParameter *)operator_new(0x20);
        SigmoidParameter::SigmoidParameter(this_22);
        this->sigmoid_param_ = this_22;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = SigmoidParameter::MergePartialFromCodedStream(this_22,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x7d:
    if (cVar20 == -0x16) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 8;
      this_21 = this->softmax_param_;
      if (this_21 == (SoftmaxParameter *)0x0) {
        this_21 = (SoftmaxParameter *)operator_new(0x20);
        SoftmaxParameter::SoftmaxParameter(this_21);
        this->softmax_param_ = this_21;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = SoftmaxParameter::MergePartialFromCodedStream(this_21,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x7e:
    if (cVar20 == -0xe) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 0x10;
      this_53 = this->slice_param_;
      if (this_53 == (SliceParameter *)0x0) {
        this_53 = (SliceParameter *)operator_new(0x30);
        SliceParameter::SliceParameter(this_53);
        this->slice_param_ = this_53;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = SliceParameter::MergePartialFromCodedStream(this_53,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x7f:
    if (cVar20 == -6) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 0x20;
      this_10 = this->tanh_param_;
      if (this_10 == (TanHParameter *)0x0) {
        this_10 = (TanHParameter *)operator_new(0x20);
        TanHParameter::TanHParameter(this_10);
        this->tanh_param_ = this_10;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = TanHParameter::MergePartialFromCodedStream(this_10,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x80:
    if (cVar20 == '\x02') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 0x40;
      this_50 = this->threshold_param_;
      if (this_50 == (ThresholdParameter *)0x0) {
        this_50 = (ThresholdParameter *)operator_new(0x20);
        ThresholdParameter::ThresholdParameter(this_50);
        this->threshold_param_ = this_50;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ThresholdParameter::MergePartialFromCodedStream(this_50,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x81:
    if (cVar20 == '\n') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar5 = *pbVar5 | 0x80;
      this_51 = this->window_data_param_;
      if (this_51 == (WindowDataParameter *)0x0) {
        this_51 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(this_51);
        this->window_data_param_ = this_51;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = WindowDataParameter::MergePartialFromCodedStream(this_51,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x82:
    if (cVar20 == '\x12') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 1;
      this_42 = this->python_param_;
      if (this_42 == (PythonParameter *)0x0) {
        this_42 = (PythonParameter *)operator_new(0x38);
        PythonParameter::PythonParameter(this_42);
        this->python_param_ = this_42;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = PythonParameter::MergePartialFromCodedStream(this_42,input);
      goto LAB_003ffbf1;
    }
    break;
  case 0x83:
    if (cVar20 == '\x1a') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 2;
      this_28 = this->prelu_param_;
      if (this_28 == (PReLUParameter *)0x0) {
        this_28 = (PReLUParameter *)operator_new(0x28);
        PReLUParameter::PReLUParameter(this_28);
        this->prelu_param_ = this_28;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = PReLUParameter::MergePartialFromCodedStream(this_28,input);
LAB_003ffc45:
      if (bVar11 == false) {
        return false;
      }
      bVar11 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                         (input,pVar14.first);
      goto joined_r0x003ffc09;
    }
    break;
  case 0x84:
    if (cVar20 == '\"') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 4;
      this_43 = this->spp_param_;
      if (this_43 == (SPPParameter *)0x0) {
        this_43 = (SPPParameter *)operator_new(0x28);
        SPPParameter::SPPParameter(this_43);
        this->spp_param_ = this_43;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = SPPParameter::MergePartialFromCodedStream(this_43,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x85:
    if (cVar20 == '*') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 8;
      this_15 = this->reshape_param_;
      if (this_15 == (ReshapeParameter *)0x0) {
        this_15 = (ReshapeParameter *)operator_new(0x28);
        ReshapeParameter::ReshapeParameter(this_15);
        this->reshape_param_ = this_15;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ReshapeParameter::MergePartialFromCodedStream(this_15,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x86:
    if (cVar20 == '2') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x10;
      this_11 = this->log_param_;
      if (this_11 == (LogParameter *)0x0) {
        this_11 = (LogParameter *)operator_new(0x28);
        LogParameter::LogParameter(this_11);
        this->log_param_ = this_11;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = LogParameter::MergePartialFromCodedStream(this_11,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x87:
    if (cVar20 == ':') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x20;
      this_08 = this->flatten_param_;
      if (this_08 == (FlattenParameter *)0x0) {
        this_08 = (FlattenParameter *)operator_new(0x20);
        FlattenParameter::FlattenParameter(this_08);
        this->flatten_param_ = this_08;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = FlattenParameter::MergePartialFromCodedStream(this_08,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x88:
    if (cVar20 == 'B') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x40;
      this_09 = this->reduction_param_;
      if (this_09 == (ReductionParameter *)0x0) {
        this_09 = (ReductionParameter *)operator_new(0x28);
        ReductionParameter::ReductionParameter(this_09);
        this->reduction_param_ = this_09;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ReductionParameter::MergePartialFromCodedStream(this_09,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x89:
    if (cVar20 == 'J') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x80;
      this_07 = this->embed_param_;
      if (this_07 == (EmbedParameter *)0x0) {
        this_07 = (EmbedParameter *)operator_new(0x38);
        EmbedParameter::EmbedParameter(this_07);
        this->embed_param_ = this_07;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = EmbedParameter::MergePartialFromCodedStream(this_07,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x8a:
    if (cVar20 == 'R') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 1;
      this_52 = this->tile_param_;
      if (this_52 == (TileParameter *)0x0) {
        this_52 = (TileParameter *)operator_new(0x20);
        TileParameter::TileParameter(this_52);
        this->tile_param_ = this_52;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = TileParameter::MergePartialFromCodedStream(this_52,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x8b:
    if (cVar20 == 'Z') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 2;
      this_46 = this->batch_norm_param_;
      if (this_46 == (BatchNormParameter *)0x0) {
        this_46 = (BatchNormParameter *)operator_new(0x28);
        BatchNormParameter::BatchNormParameter(this_46);
        this->batch_norm_param_ = this_46;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = BatchNormParameter::MergePartialFromCodedStream(this_46,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x8c:
    if (cVar20 == 'b') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 4;
      this_18 = this->elu_param_;
      if (this_18 == (ELUParameter *)0x0) {
        this_18 = (ELUParameter *)operator_new(0x20);
        ELUParameter::ELUParameter(this_18);
        this->elu_param_ = this_18;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ELUParameter::MergePartialFromCodedStream(this_18,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x8d:
    if (cVar20 == 'j') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 8;
      this_31 = this->bias_param_;
      if (this_31 == (BiasParameter *)0x0) {
        this_31 = (BiasParameter *)operator_new(0x28);
        BiasParameter::BiasParameter(this_31);
        this->bias_param_ = this_31;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = BiasParameter::MergePartialFromCodedStream(this_31,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x8e:
    if (cVar20 == 'r') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 0x10;
      this_48 = this->scale_param_;
      if (this_48 == (ScaleParameter *)0x0) {
        this_48 = (ScaleParameter *)operator_new(0x38);
        ScaleParameter::ScaleParameter(this_48);
        this->scale_param_ = this_48;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ScaleParameter::MergePartialFromCodedStream(this_48,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x8f:
    if (cVar20 == 'z') {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 0x20;
      this_06 = this->input_param_;
      if (this_06 == (InputParameter *)0x0) {
        this_06 = (InputParameter *)operator_new(0x30);
        InputParameter::InputParameter(this_06);
        this->input_param_ = this_06;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = InputParameter::MergePartialFromCodedStream(this_06,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x90:
    if (cVar20 == -0x7e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 0x40;
      this_13 = this->crop_param_;
      if (this_13 == (CropParameter *)0x0) {
        this_13 = (CropParameter *)operator_new(0x30);
        CropParameter::CropParameter(this_13);
        this->crop_param_ = this_13;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = CropParameter::MergePartialFromCodedStream(this_13,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x91:
    if (cVar20 == -0x76) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar5 = *pbVar5 | 0x80;
      this_44 = this->parameter_param_;
      if (this_44 == (ParameterParameter *)0x0) {
        this_44 = (ParameterParameter *)operator_new(0x20);
        ParameterParameter::ParameterParameter(this_44);
        this->parameter_param_ = this_44;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = ParameterParameter::MergePartialFromCodedStream(this_44,input);
      goto LAB_003ffc45;
    }
    break;
  case 0x92:
    if (cVar20 == -0x6e) {
      pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 6);
      *pbVar5 = *pbVar5 | 1;
      this_54 = this->recurrent_param_;
      if (this_54 == (RecurrentParameter *)0x0) {
        this_54 = (RecurrentParameter *)operator_new(0x30);
        RecurrentParameter::RecurrentParameter(this_54);
        this->recurrent_param_ = this_54;
      }
      puVar7 = input->buffer_;
      if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
        input->buffer_ = puVar7 + 1;
      }
      else {
        iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar12 < 0) {
          return false;
        }
      }
      pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                         (input,iVar12);
      if ((long)pVar14 < 0) {
        return false;
      }
      bVar11 = RecurrentParameter::MergePartialFromCodedStream(this_54,input);
      goto LAB_003ffc45;
    }
    break;
  default:
    switch(uVar10) {
    case 1:
      if (cVar20 == '\n') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        psVar15 = (this->name_).ptr_;
        if (psVar15 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_04,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar15 = this_04->ptr_;
        }
        bVar11 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar15);
        if (!bVar11) {
          return false;
        }
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((this_04->ptr_->_M_dataplus)._M_p,(int)this_04->ptr_->_M_string_length,PARSE,
                   "caffe.LayerParameter.name");
        goto LAB_003fdd74;
      }
      break;
    case 2:
      if (cVar20 == '\x12') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        psVar15 = (this->type_).ptr_;
        if (psVar15 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_03,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar15 = this_03->ptr_;
        }
        bVar11 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar15);
        if (!bVar11) {
          return false;
        }
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  ((this_03->ptr_->_M_dataplus)._M_p,(int)this_03->ptr_->_M_string_length,PARSE,
                   "caffe.LayerParameter.type");
        goto LAB_003fdd74;
      }
      break;
    case 3:
      if (cVar20 == '\x1a') {
        pRVar19 = (this->bottom_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar19 == (Rep *)0x0) {
          iVar12 = (this->bottom_).super_RepeatedPtrFieldBase.total_size_;
LAB_003ffc8c:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_02->super_RepeatedPtrFieldBase,iVar12 + 1);
          pRVar19 = (this->bottom_).super_RepeatedPtrFieldBase.rep_;
          iVar12 = pRVar19->allocated_size;
LAB_003ffc9e:
          pRVar19->allocated_size = iVar12 + 1;
          pAVar8 = (this_02->super_RepeatedPtrFieldBase).arena_;
          if (pAVar8 == (Arena *)0x0) {
            psVar15 = (string *)operator_new(0x20);
            (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
            psVar15->_M_string_length = 0;
            (psVar15->field_2)._M_local_buf[0] = '\0';
          }
          else {
            psVar15 = (string *)
                      google::protobuf::Arena::AllocateAligned
                                (pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
            psVar15->_M_string_length = 0;
            (psVar15->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (pAVar8,psVar15,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
            pRVar19 = (this->bottom_).super_RepeatedPtrFieldBase.rep_;
          }
          iVar12 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
          (this->bottom_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
          pRVar19->elements[iVar12] = psVar15;
        }
        else {
          iVar4 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
          iVar12 = pRVar19->allocated_size;
          if (iVar12 <= iVar4) {
            if (iVar12 == (this->bottom_).super_RepeatedPtrFieldBase.total_size_) goto LAB_003ffc8c;
            goto LAB_003ffc9e;
          }
          (this->bottom_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
          psVar15 = (string *)pRVar19->elements[iVar4];
        }
        bVar11 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar15);
        if (!bVar11) {
          return false;
        }
        pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_02->super_RepeatedPtrFieldBase,
                             (this->bottom_).super_RepeatedPtrFieldBase.current_size_ + -1);
        pcVar9 = (pTVar16->_M_dataplus)._M_p;
        pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_02->super_RepeatedPtrFieldBase,
                             (this->bottom_).super_RepeatedPtrFieldBase.current_size_ + -1);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (pcVar9,(int)pTVar16->_M_string_length,PARSE,"caffe.LayerParameter.bottom");
        goto LAB_003fdd74;
      }
      break;
    case 4:
      if (cVar20 == '\"') {
        pRVar19 = (this->top_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar19 == (Rep *)0x0) {
          iVar12 = (this->top_).super_RepeatedPtrFieldBase.total_size_;
LAB_003ffd03:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_01->super_RepeatedPtrFieldBase,iVar12 + 1);
          pRVar19 = (this->top_).super_RepeatedPtrFieldBase.rep_;
          iVar12 = pRVar19->allocated_size;
LAB_003ffd15:
          pRVar19->allocated_size = iVar12 + 1;
          pAVar8 = (this_01->super_RepeatedPtrFieldBase).arena_;
          if (pAVar8 == (Arena *)0x0) {
            psVar15 = (string *)operator_new(0x20);
            (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
            psVar15->_M_string_length = 0;
            (psVar15->field_2)._M_local_buf[0] = '\0';
          }
          else {
            psVar15 = (string *)
                      google::protobuf::Arena::AllocateAligned
                                (pAVar8,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (psVar15->_M_dataplus)._M_p = (pointer)&psVar15->field_2;
            psVar15->_M_string_length = 0;
            (psVar15->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (pAVar8,psVar15,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
            pRVar19 = (this->top_).super_RepeatedPtrFieldBase.rep_;
          }
          iVar12 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
          (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar12 + 1;
          pRVar19->elements[iVar12] = psVar15;
        }
        else {
          iVar4 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
          iVar12 = pRVar19->allocated_size;
          if (iVar12 <= iVar4) {
            if (iVar12 == (this->top_).super_RepeatedPtrFieldBase.total_size_) goto LAB_003ffd03;
            goto LAB_003ffd15;
          }
          (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
          psVar15 = (string *)pRVar19->elements[iVar4];
        }
        bVar11 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar15);
        if (!bVar11) {
          return false;
        }
        pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,
                             (this->top_).super_RepeatedPtrFieldBase.current_size_ + -1);
        pcVar9 = (pTVar16->_M_dataplus)._M_p;
        pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_01->super_RepeatedPtrFieldBase,
                             (this->top_).super_RepeatedPtrFieldBase.current_size_ + -1);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (pcVar9,(int)pTVar16->_M_string_length,PARSE,"caffe.LayerParameter.top");
        goto LAB_003fdd74;
      }
      break;
    case 5:
      if (cVar20 == '*') {
        bVar11 = google::protobuf::internal::WireFormatLite::
                 ReadPackedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                           (input,&this->loss_weight_);
      }
      else {
        if ((uVar21 & 0xff) != 0x2d) break;
        bVar11 = google::protobuf::internal::WireFormatLite::
                 ReadRepeatedPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                           (1,0x2d,input,&this->loss_weight_);
      }
      goto LAB_003ff1cc;
    case 6:
      if (cVar20 == '2') {
        this_30 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                            (&(this->param_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
          input->buffer_ = puVar7 + 1;
        }
        else {
          iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar12 < 0) {
            return false;
          }
        }
        pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar12);
        if ((long)pVar14 < 0) {
          return false;
        }
        bVar11 = ParamSpec::MergePartialFromCodedStream(this_30,input);
        goto LAB_003ffbf1;
      }
      break;
    case 7:
      if (cVar20 == ':') {
        this_35 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                            (&(this->blobs_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
          input->buffer_ = puVar7 + 1;
        }
        else {
          iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar12 < 0) {
            return false;
          }
        }
        pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar12);
        if ((long)pVar14 < 0) {
          return false;
        }
        bVar11 = BlobProto::MergePartialFromCodedStream(this_35,input);
        goto LAB_003ffbf1;
      }
      break;
    case 8:
      this_55 = &(this->include_).super_RepeatedPtrFieldBase;
      if (cVar20 == 'B') {
LAB_003febad:
        this_38 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                            (this_55,(Type *)0x0);
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (iVar12 = (int)(char)*puVar7, -1 < iVar12)) {
          input->buffer_ = puVar7 + 1;
        }
        else {
          iVar12 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar12 < 0) {
            return false;
          }
        }
        pVar14 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar12);
        if ((long)pVar14 < 0) {
          return false;
        }
        bVar11 = NetStateRule::MergePartialFromCodedStream(this_38,input);
        goto LAB_003ffbf1;
      }
      break;
    case 9:
      this_55 = &(this->exclude_).super_RepeatedPtrFieldBase;
      if (cVar20 == 'J') goto LAB_003febad;
      break;
    case 10:
      if (cVar20 == 'P') {
        pbVar5 = input->buffer_;
        if (pbVar5 < input->buffer_end_) {
          bVar3 = *pbVar5;
          uVar13 = (uint32)bVar3;
          uVar21 = (uint)bVar3;
          if ((char)bVar3 < '\0') goto LAB_003ffeb8;
          input->buffer_ = pbVar5 + 1;
        }
        else {
          uVar13 = 0;
LAB_003ffeb8:
          iVar17 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar13);
          uVar21 = (uint)iVar17;
          if (iVar17 < 0) {
            return false;
          }
        }
        if (uVar21 < 2) {
          pbVar5 = (byte *)((long)(this->_has_bits_).has_bits_ + 6);
          *pbVar5 = *pbVar5 | 2;
          this->phase_ = uVar21;
        }
        else {
          pvVar6 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar6 & 1) == 0) {
            pUVar18 = google::protobuf::internal::
                      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ::mutable_unknown_fields_slow
                                (&this_00->
                                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                );
          }
          else {
            pUVar18 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
          }
          google::protobuf::UnknownFieldSet::AddVarint(pUVar18,10,(long)(int)uVar21);
        }
        goto LAB_003fdd74;
      }
      break;
    case 0xb:
      if (cVar20 == 'Z') {
        bVar11 = google::protobuf::internal::WireFormatLite::
                 ReadPackedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                           (input,&this->propagate_down_);
      }
      else {
        if ((uVar21 & 0xff) != 0x58) break;
        bVar11 = google::protobuf::internal::WireFormatLite::
                 ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                           (1,0x58,input,&this->propagate_down_);
      }
LAB_003ff1cc:
      if (bVar11 == false) {
        return false;
      }
      goto LAB_003fdd74;
    }
  }
switchD_003fdea5_default:
  if (uVar21 == 0) {
    return true;
  }
  if ((uVar21 & 7) == 4) {
    return true;
  }
  pvVar6 = (this_00->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar6 & 1) == 0) {
    pUVar18 = google::protobuf::internal::
              InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ::mutable_unknown_fields_slow
                        (&this_00->
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                        );
  }
  else {
    pUVar18 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  bVar11 = google::protobuf::internal::WireFormat::SkipField(input,uVar21,pUVar18);
joined_r0x003ffc09:
  if (!bVar11) {
    return false;
  }
  goto LAB_003fdd74;
}

Assistant:

bool LayerParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.LayerParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.name");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string type = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->type().data(), this->type().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.type");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string bottom = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_bottom()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->bottom(this->bottom_size() - 1).data(),
            this->bottom(this->bottom_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.bottom");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string top = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_top()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->top(this->top_size() - 1).data(),
            this->top(this->top_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.LayerParameter.top");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated float loss_weight = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(45u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 1, 45u, input, this->mutable_loss_weight())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(42u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, this->mutable_loss_weight())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.ParamSpec param = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.BlobProto blobs = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_blobs()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule include = 8;
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(66u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_include()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .caffe.NetStateRule exclude = 9;
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(74u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_exclude()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.Phase phase = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(10, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated bool propagate_down = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 1, 88u, input, this->mutable_propagate_down())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(90u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitiveNoInline<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, this->mutable_propagate_down())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TransformationParameter transform_param = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_transform_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LossParameter loss_param = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.AccuracyParameter accuracy_param = 102;
      case 102: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(818u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_accuracy_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ArgMaxParameter argmax_param = 103;
      case 103: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(826u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_argmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConcatParameter concat_param = 104;
      case 104: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(834u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_concat_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
      case 105: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(842u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_contrastive_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ConvolutionParameter convolution_param = 106;
      case 106: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(850u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_convolution_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DataParameter data_param = 107;
      case 107: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(858u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DropoutParameter dropout_param = 108;
      case 108: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(866u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dropout_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.DummyDataParameter dummy_data_param = 109;
      case 109: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(874u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_dummy_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EltwiseParameter eltwise_param = 110;
      case 110: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(882u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_eltwise_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ExpParameter exp_param = 111;
      case 111: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(890u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_exp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
      case 112: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(898u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
      case 113: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(906u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hdf5_output_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.HingeLossParameter hinge_loss_param = 114;
      case 114: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(914u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_hinge_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ImageDataParameter image_data_param = 115;
      case 115: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(922u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_image_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
      case 116: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(930u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_infogain_loss_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InnerProductParameter inner_product_param = 117;
      case 117: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(938u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_inner_product_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LRNParameter lrn_param = 118;
      case 118: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(946u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_lrn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MemoryDataParameter memory_data_param = 119;
      case 119: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(954u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_memory_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.MVNParameter mvn_param = 120;
      case 120: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(962u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_mvn_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PoolingParameter pooling_param = 121;
      case 121: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(970u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_pooling_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PowerParameter power_param = 122;
      case 122: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(978u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_power_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReLUParameter relu_param = 123;
      case 123: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(986u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_relu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SigmoidParameter sigmoid_param = 124;
      case 124: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(994u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_sigmoid_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SoftmaxParameter softmax_param = 125;
      case 125: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1002u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_softmax_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SliceParameter slice_param = 126;
      case 126: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1010u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_slice_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TanHParameter tanh_param = 127;
      case 127: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1018u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tanh_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ThresholdParameter threshold_param = 128;
      case 128: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1026u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_threshold_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.WindowDataParameter window_data_param = 129;
      case 129: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1034u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_window_data_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PythonParameter python_param = 130;
      case 130: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1042u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_python_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.PReLUParameter prelu_param = 131;
      case 131: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1050u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_prelu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter spp_param = 132;
      case 132: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1058u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_spp_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReshapeParameter reshape_param = 133;
      case 133: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1066u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reshape_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.LogParameter log_param = 134;
      case 134: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1074u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_log_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.FlattenParameter flatten_param = 135;
      case 135: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1082u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_flatten_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ReductionParameter reduction_param = 136;
      case 136: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1090u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_reduction_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.EmbedParameter embed_param = 137;
      case 137: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1098u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_embed_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.TileParameter tile_param = 138;
      case 138: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_tile_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BatchNormParameter batch_norm_param = 139;
      case 139: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1114u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_batch_norm_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ELUParameter elu_param = 140;
      case 140: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_elu_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.BiasParameter bias_param = 141;
      case 141: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1130u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_bias_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ScaleParameter scale_param = 142;
      case 142: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1138u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_scale_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.InputParameter input_param = 143;
      case 143: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1146u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_input_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.CropParameter crop_param = 144;
      case 144: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1154u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_crop_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.ParameterParameter parameter_param = 145;
      case 145: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_parameter_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.RecurrentParameter recurrent_param = 146;
      case 146: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(1170u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_recurrent_param()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.LayerParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.LayerParameter)
  return false;
#undef DO_
}